

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O0

CallResult __thiscall miniros::PeerConnDisconnCallback::call(PeerConnDisconnCallback *this)

{
  bool bVar1;
  function<void_(const_miniros::SingleSubscriberPublisher_&)> *in_RDI;
  SingleSubscriberPublisher pub;
  VoidConstPtr tracker;
  SingleSubscriberPublisher *in_stack_ffffffffffffff98;
  weak_ptr<const_void> *in_stack_ffffffffffffffa8;
  __shared_ptr local_20 [28];
  CallResult local_4;
  
  std::shared_ptr<const_void>::shared_ptr((shared_ptr<const_void> *)0x48e3dd);
  if (((ulong)in_RDI[1]._M_invoker & 1) != 0) {
    std::weak_ptr<const_void>::lock(in_stack_ffffffffffffffa8);
    std::shared_ptr<const_void>::operator=
              ((shared_ptr<const_void> *)in_RDI,(shared_ptr<const_void> *)in_stack_ffffffffffffff98)
    ;
    std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)0x48e414);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
    if (!bVar1) {
      local_4 = Invalid;
      goto LAB_0048e4a6;
    }
  }
  SingleSubscriberPublisher::SingleSubscriberPublisher
            ((SingleSubscriberPublisher *)in_RDI,&in_stack_ffffffffffffff98->link_);
  std::function<void_(const_miniros::SingleSubscriberPublisher_&)>::operator()
            (in_RDI,in_stack_ffffffffffffff98);
  local_4 = Success;
  SingleSubscriberPublisher::~SingleSubscriberPublisher((SingleSubscriberPublisher *)0x48e47a);
LAB_0048e4a6:
  std::shared_ptr<const_void>::~shared_ptr((shared_ptr<const_void> *)0x48e4b0);
  return local_4;
}

Assistant:

virtual CallResult call()
  {
    VoidConstPtr tracker;
    if (use_tracked_object_)
    {
      tracker = tracked_object_.lock();

      if (!tracker)
      {
        return Invalid;
      }
    }

    SingleSubscriberPublisher pub(sub_link_);
    callback_(pub);

    return Success;
  }